

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_netinfo.cpp
# Opt level: O0

int __thiscall userinfo_t::GenderChanged(userinfo_t *this,char *gendername)

{
  int intval;
  FBaseCVar **ppFVar1;
  FName local_20;
  int local_1c;
  char *pcStack_18;
  int gendernum;
  char *gendername_local;
  userinfo_t *this_local;
  
  pcStack_18 = gendername;
  gendername_local = (char *)this;
  intval = D_GenderToInt(gendername);
  local_1c = intval;
  FName::FName(&local_20,NAME_Gender);
  ppFVar1 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::operator[]
                      (&this->
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       ,&local_20);
  FIntCVar::operator=((FIntCVar *)*ppFVar1,intval);
  return local_1c;
}

Assistant:

int userinfo_t::GenderChanged(const char *gendername)
{
	int gendernum = D_GenderToInt(gendername);
	*static_cast<FIntCVar *>((*this)[NAME_Gender]) = gendernum;
	return gendernum;
}